

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCast::Operation<float,unsigned_char>(float input,uint8_t *result,bool strict)

{
  bool bVar1;
  
  bVar1 = TryCastWithOverflowCheckFloat<float,unsigned_char>(input,result,0.0,256.0);
  return bVar1;
}

Assistant:

bool TryCast::Operation(float input, uint8_t &result, bool strict) {
	return NumericTryCast::Operation<float, uint8_t>(input, result, strict);
}